

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O0

void golf_gi_add_lightmap_section
               (golf_gi_t *gi,golf_lightmap_section_t *lightmap_section,golf_model_t *model,
               golf_transform_t transform,golf_movement_t movement,_Bool should_draw)

{
  golf_gi_lightmap_section_t *pgVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  long lVar6;
  vec3 *pvVar7;
  vec2 vVar8;
  int local_e4;
  int i;
  int n___1;
  int i___1;
  int n__;
  int i__;
  golf_gi_lightmap_section_t section;
  _Bool should_draw_local;
  golf_model_t *model_local;
  golf_lightmap_section_t *lightmap_section_local;
  golf_gi_t *gi_local;
  
  if ((gi->has_cur_entity & 1U) != 0) {
    section.lightmap_section._7_1_ = should_draw;
    memset((void *)((long)&section.movement.field_4 + 0x10),0,0x18);
    section.positions._8_8_ = (long)"glGetStringi" + 10;
    memset(&section.positions.alloc_category,0,0x18);
    section.normals._8_8_ = (long)"glGetStringi" + 10;
    memset(&section.normals.alloc_category,0,0x18);
    section.lightmap_uvs._8_8_ = (long)"glGetStringi" + 10;
    iVar4 = (model->positions).length;
    iVar3 = vec_reserve_po2_((char **)((long)&section.movement.field_4 + 0x10),
                             (int *)&section.positions,(int *)((long)&section.positions.data + 4),
                             0xc,(int)section.positions.data + iVar4,(char *)section.positions._8_8_
                            );
    if (iVar3 == 0) {
      for (i___1 = 0; i___1 < iVar4; i___1 = i___1 + 1) {
        puVar5 = (undefined8 *)
                 (section.movement.field_4._16_8_ + (long)(int)section.positions.data * 0xc);
        pvVar7 = (model->positions).data + i___1;
        *puVar5 = *(undefined8 *)pvVar7;
        *(float *)(puVar5 + 1) = pvVar7->z;
        section.positions.data._0_4_ = (int)section.positions.data + 1;
      }
    }
    iVar4 = (model->normals).length;
    iVar3 = vec_reserve_po2_(&section.positions.alloc_category,(int *)&section.normals,
                             (int *)((long)&section.normals.data + 4),0xc,
                             (int)section.normals.data + iVar4,(char *)section.normals._8_8_);
    if (iVar3 == 0) {
      for (i = 0; i < iVar4; i = i + 1) {
        pvVar7 = (model->normals).data + i;
        *(undefined8 *)(section.positions.alloc_category + (long)(int)section.normals.data * 0xc) =
             *(undefined8 *)pvVar7;
        *(float *)(section.positions.alloc_category + (long)(int)section.normals.data * 0xc + 8) =
             pvVar7->z;
        section.normals.data._0_4_ = (int)section.normals.data + 1;
      }
    }
    for (local_e4 = 0; local_e4 < (model->positions).length; local_e4 = local_e4 + 1) {
      iVar4 = vec_expand_(&section.normals.alloc_category,(int *)&section.lightmap_uvs,
                          (int *)((long)&section.lightmap_uvs.data + 4),8,
                          (char *)section.lightmap_uvs._8_8_);
      pcVar2 = section.normals.alloc_category;
      if (iVar4 == 0) {
        lVar6 = (long)(int)section.lightmap_uvs.data;
        section.lightmap_uvs.data._0_4_ = (int)section.lightmap_uvs.data + 1;
        vVar8 = vec2_create(0.0,0.0);
        *(vec2 *)(pcVar2 + lVar6 * 8) = vVar8;
      }
    }
    memcpy(&n__,&transform,0x28);
    memcpy(&section.transform.scale.y,&movement,0x28);
    section.lightmap_uvs.alloc_category._0_1_ = section.lightmap_section._7_1_ & 1;
    section._152_8_ = lightmap_section;
    iVar4 = vec_expand_((char **)&(gi->cur_entity).gi_lightmap_sections,
                        &(gi->cur_entity).gi_lightmap_sections.length,
                        &(gi->cur_entity).gi_lightmap_sections.capacity,0xa8,
                        (gi->cur_entity).gi_lightmap_sections.alloc_category);
    if (iVar4 == 0) {
      pgVar1 = (gi->cur_entity).gi_lightmap_sections.data;
      iVar4 = (gi->cur_entity).gi_lightmap_sections.length;
      (gi->cur_entity).gi_lightmap_sections.length = iVar4 + 1;
      memcpy(pgVar1 + iVar4,&n__,0xa8);
    }
  }
  return;
}

Assistant:

void golf_gi_add_lightmap_section(golf_gi_t *gi, golf_lightmap_section_t *lightmap_section, golf_model_t *model, golf_transform_t transform, golf_movement_t movement, bool should_draw) {
    if (!gi->has_cur_entity) {
        return;
    }

    golf_gi_lightmap_section_t section;
    vec_init(&section.positions, "gi");
    vec_init(&section.normals, "gi");
    vec_init(&section.lightmap_uvs, "gi");
    vec_pusharr(&section.positions, model->positions.data, model->positions.length);
    vec_pusharr(&section.normals, model->normals.data, model->normals.length);
    for (int i = 0; i < model->positions.length; i++) {
        vec_push(&section.lightmap_uvs, V2(0, 0));
    }
    section.transform = transform;
    section.movement = movement;
    section.lightmap_section = lightmap_section;
    section.should_draw = should_draw;
    vec_push(&gi->cur_entity.gi_lightmap_sections, section);
}